

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.h
# Opt level: O0

ON_MorphControl * __thiscall
ON_MorphControl::operator=(ON_MorphControl *this,ON_MorphControl *param_1)

{
  bool bVar1;
  ON_MorphControl *param_1_local;
  ON_MorphControl *this_local;
  
  ON_Geometry::operator=(&this->super_ON_Geometry,&param_1->super_ON_Geometry);
  this->m_varient = param_1->m_varient;
  ON_NurbsCurve::operator=(&this->m_nurbs_curve0,&param_1->m_nurbs_curve0);
  ON_NurbsCurve::operator=(&this->m_nurbs_curve,&param_1->m_nurbs_curve);
  (this->m_nurbs_curve_domain).m_t[0] = (param_1->m_nurbs_curve_domain).m_t[0];
  (this->m_nurbs_curve_domain).m_t[1] = (param_1->m_nurbs_curve_domain).m_t[1];
  ON_NurbsSurface::operator=(&this->m_nurbs_surface0,&param_1->m_nurbs_surface0);
  ON_NurbsSurface::operator=(&this->m_nurbs_surface,&param_1->m_nurbs_surface);
  memcpy(&this->field_0x158,&param_1->field_0x158,0xa0);
  ON_NurbsCage::operator=(&this->m_nurbs_cage,&param_1->m_nurbs_cage);
  ON_UuidList::operator=(&this->m_captive_id,&param_1->m_captive_id);
  ON_ClassArray<ON_Localizer>::operator=(&this->m_localizers,&param_1->m_localizers);
  this->m_sporh_tolerance = param_1->m_sporh_tolerance;
  bVar1 = param_1->m_sporh_bPreserveStructure;
  this->m_sporh_bQuickPreview = param_1->m_sporh_bQuickPreview;
  this->m_sporh_bPreserveStructure = bVar1;
  return this;
}

Assistant:

class ON_CLASS ON_MorphControl : public ON_Geometry
{
  ON_OBJECT_DECLARE(ON_MorphControl);

public:
  ON_MorphControl();
  virtual ~ON_MorphControl();
  // C++ default copy construction and operator= work fine.


  void Destroy();
  

  /////////////////////////////////////////////////////////
  //
  // ON_Object virtual functions
  //

  void MemoryRelocate() override;

  bool IsValid( class ON_TextLog* text_log = nullptr ) const override;

  void Dump( ON_TextLog& ) const override;

  unsigned int SizeOf() const override;

  bool Write(
    ON_BinaryArchive& archive
    ) const override;

  bool Read(
    ON_BinaryArchive& archive
    ) override;

  ON::object_type ObjectType() const override;

  void DestroyRuntimeCache( bool bDelete = true ) override;

  /////////////////////////////////////////////////////////
  //
  // ON_Geometry virtual functions
  //

  int Dimension() const override;

  // virtual ON_Geometry GetBBox override		
  bool GetBBox( double* boxmin, double* boxmax, bool bGrowBox = false ) const override;

  // virtual ON_Geometry GetTightBoundingBox override		
  bool GetTightBoundingBox( class ON_BoundingBox& tight_bbox, bool bGrowBox = false, const class ON_Xform* xform = nullptr ) const override;

  void ClearBoundingBox() override;

  bool Transform( 
         const ON_Xform& xform
         ) override;


  bool HasBrepForm() const override;

  ON_Brep* BrepForm( ON_Brep* brep = nullptr ) const override;


  /*
  Returns:
    True if the target NURBS object is rational
  */
  bool IsRational() const;

  /*
  Description:
    Makes the target NURBS object rational.
  */
  bool MakeRational();

  /*
  Description:
    Makes the target NURBS object non-rational.
  */
  bool MakeNonRational();

  /*
  Returns:
    Number of control points in the target NURBS object.
  */
  int CVCount() const;

  int CVCount(int dir) const;
  int Order(int dir) const;
  const double* Knot(int dir) const;
  ON_3dex MaxCVIndex() const;
  const double* CV(ON_3dex) const;
  double Weight(ON_3dex) const;

  /////////////////////////////////////////////////////////
  //
  // Localizers
  //

  /*
  Description:
    Adds localizer with support near the controlling NURBS object.
  Parameters:
    support_distance - [in] >= 0
      If the distance a point to the controls NURBS 
      curve/surface/cage is less than or equal to support_distance,
      then MorphPoint() deformation has 100% effect.
      
    falloff_distance - [in] > 0
      If the distance a point to the controls NURBS 
      curve/surface/cage is more than support_distance+falloff_distance,
      then MorphPoint() deformation does not move the point.
      As the distance varies from support_distance to 
      support_distance+falloff_distance the deformation attenuates
      from 100% to 0%.
  */
  bool AddControlLocalizer(
    double support_distance, 
    double falloff_distance
    );

  bool AddSphereLocalizer(
    ON_3dPoint center,
    double support_distance, 
    double falloff_distance
    );

  bool AddCylinderLocalizer(
    ON_Line axis,
    double support_distance, 
    double falloff_distance
    );

  bool AddBoxLocalizer(
    ON_BoundingBox bbox,
    double support_distance, 
    double falloff_distance
    );

  bool AddPlaneLocalizer(
    const ON_Plane& plane,
    double support_distance, 
    double falloff_distance
    );

  bool AddConvexPolygonLocalizer(
    const ON_SimpleArray<ON_Plane>& planes,
    double support_distance, 
    double falloff_distance
    );

  /////////////////////////////////////////////////////////
  //
  //

  // Get a cage_morph that can be passed to Morph functions
  bool GetCageMorph( class ON_CageMorph& cage_morph ) const;


  bool IsIdentity( const ON_BoundingBox& bbox ) const;

  int m_varient; // 1= curve, 2 = surface, 3 = cage

  // The value of m_varient determines which nurbs object
  // controls the cage
  ON_NurbsCurve   m_nurbs_curve0;
  ON_NurbsCurve   m_nurbs_curve;
  ON_Interval     m_nurbs_curve_domain;

  ON_NurbsSurface m_nurbs_surface0;
  ON_NurbsSurface m_nurbs_surface;
  ON_Interval     m_nurbs_surface_domain[2];

  ON_Xform        m_nurbs_cage0 = ON_Xform::IdentityTransformation;
  ON_NurbsCage    m_nurbs_cage;

  // Rhino captive object ids
  ON_UuidList m_captive_id;

  // Use ON_GetCageXform to set m_cage_xform.

  // Used to localize the deformation
  ON_ClassArray<ON_Localizer> m_localizers;

  // ON_SpaceMorphOptions
  double m_sporh_tolerance;
  bool   m_sporh_bQuickPreview;
  bool   m_sporh_bPreserveStructure;
}